

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  pointer pcVar2;
  int iVar3;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  size_t local_b0;
  size_t sStack_a8;
  undefined **local_a0;
  long *local_98 [2];
  long local_88 [2];
  size_t local_78;
  size_t sStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38;
  
  pIVar1 = (this->m_reporter).m_p;
  local_d0 = local_c0;
  pcVar2 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + testSpec->_M_string_length);
  local_b0 = groupIndex;
  sStack_a8 = groupsCount;
  iVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])(this);
  local_a0 = &PTR__TestGroupStats_00169190;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)local_98,local_d0,local_c8 + (long)local_d0);
  local_78 = local_b0;
  sStack_70 = sStack_a8;
  local_68 = (undefined4)(totals->assertions).passed;
  uStack_64 = *(undefined4 *)((long)&(totals->assertions).passed + 4);
  uStack_60 = (undefined4)(totals->assertions).failed;
  uStack_5c = *(undefined4 *)((long)&(totals->assertions).failed + 4);
  local_58 = (undefined4)(totals->assertions).failedButOk;
  uStack_54 = *(undefined4 *)((long)&(totals->assertions).failedButOk + 4);
  uStack_50 = (undefined4)(totals->testCases).passed;
  uStack_4c = *(undefined4 *)((long)&(totals->testCases).passed + 4);
  local_48 = (undefined4)(totals->testCases).failed;
  uStack_44 = *(undefined4 *)((long)&(totals->testCases).failed + 4);
  uStack_40 = (undefined4)(totals->testCases).failedButOk;
  uStack_3c = *(undefined4 *)((long)&(totals->testCases).failedButOk + 4);
  local_38 = (undefined1)iVar3;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar1);
  local_a0 = &PTR__TestGroupStats_00169190;
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }